

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

DefinitionSymbol * __thiscall
slang::ast::Compilation::getDefinition
          (Compilation *this,ConfigBlockSymbol *config,string_view cellName,string_view libName,
          SourceRange sourceRange)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  format_args args;
  string_view fmt;
  bool bVar1;
  uint n_;
  char *pcVar2;
  size_t sVar3;
  group_type *pgVar4;
  value_type *pvVar5;
  pointer ppVar6;
  reference ppSVar7;
  Diagnostic *pDVar8;
  char *in_RDI;
  size_t in_R8;
  char *in_R9;
  iterator iVar9;
  string errorName;
  DefinitionSymbol *def;
  Symbol *defSym;
  const_iterator __end3;
  const_iterator __begin3;
  vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *__range3;
  DefinitionSymbol *foundDef;
  const_iterator defIt;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffce8;
  Diagnostic *in_stack_fffffffffffffcf0;
  Symbol *in_stack_fffffffffffffcf8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffd00;
  undefined1 *puVar10;
  char *pcVar11;
  char *pcVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  undefined1 local_298 [64];
  __sv_type local_258;
  size_t local_248;
  char *local_240;
  DefinitionSymbol *local_238;
  Symbol *local_230;
  Symbol **local_228;
  __normal_iterator<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
  local_220;
  pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> *local_218;
  DefinitionSymbol *local_210;
  const_iterator local_208;
  pointer local_1f8;
  Scope *in_stack_fffffffffffffe28;
  SourceRange in_stack_fffffffffffffe30;
  char_pointer puVar13;
  DiagCode code;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  undefined1 local_190 [16];
  DefinitionSymbol *local_180;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_178;
  char *local_170;
  char_pointer local_168;
  table_element_pointer local_160;
  undefined1 local_158 [32];
  undefined8 local_138;
  undefined1 *local_130;
  char *local_128;
  undefined8 uStack_120;
  undefined1 *local_118;
  basic_string_view<char,_std::char_traits<char>_> *local_110;
  char *local_108;
  undefined8 uStack_100;
  undefined1 *local_f8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_f0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_e0;
  char *local_d8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_d0;
  undefined1 local_c0 [16];
  pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
  *in_stack_ffffffffffffff50;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar14;
  char *pcVar15;
  char_pointer puVar16;
  table_element_pointer local_90;
  uint local_54;
  pow2_quadratic_prober local_40;
  size_t local_30;
  size_t local_28;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_20;
  char *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  puVar10 = &stack0x00000008;
  pcVar2 = in_RDI + 0x238;
  local_1a0._M_len = in_R8;
  local_1a0._M_str = in_R9;
  local_1f8 = std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
              ::get((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                     *)in_stack_fffffffffffffcf0);
  std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::RootSymbol_*>::
  tuple<std::basic_string_view<char,_std::char_traits<char>_>_&,_slang::ast::RootSymbol_*,_true>
            ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::RootSymbol_*>
              *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,(RootSymbol **)0x7bfcc0);
  std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>::
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::RootSymbol_*,_true>
            ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
              *)in_stack_fffffffffffffcf0,
             (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::RootSymbol_*>
              *)in_stack_fffffffffffffce8);
  pcVar11 = pcVar2;
  local_178.values_ = (value<fmt::v11::context> *)&stack0xfffffffffffffe28;
  local_170 = pcVar2;
  local_e0.values_ = (value<fmt::v11::context> *)&stack0xfffffffffffffe28;
  local_d8 = pcVar2;
  aVar14.values_ = (value<fmt::v11::context> *)&stack0xfffffffffffffe28;
  pcVar15 = pcVar2;
  sVar3 = boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
          ::
          hash_for<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                    ((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                      *)in_stack_fffffffffffffcf0,
                     (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                      *)in_stack_fffffffffffffce8);
  local_28 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
             ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                             *)in_stack_fffffffffffffcf0,(size_t)in_stack_fffffffffffffce8);
  pcVar12 = pcVar11;
  local_30 = sVar3;
  local_20.values_ = (value<fmt::v11::context> *)&stack0xfffffffffffffe28;
  local_18 = pcVar11;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_40,local_28);
  do {
    sVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_40);
    pgVar4 = boost::unordered::detail::foa::
             table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
             ::groups((table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                       *)0x7bfe09);
    local_54 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match((group15<boost::unordered::detail::foa::plain_integral> *)
                       in_stack_fffffffffffffcf8,(size_t)in_stack_fffffffffffffcf0);
    if (local_54 != 0) {
      pvVar5 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
               ::elements((table_arrays<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                           *)0x7bfe54);
      do {
        n_ = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffffcf8 =
             (Symbol *)
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
             ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                     *)0x7bfea4);
        in_stack_fffffffffffffd00 = local_20;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
        ::
        key_from<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>
                  ((pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
                    *)0x7bfed1);
        bVar1 = std::
                equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>
                ::operator()((equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>
                              *)in_stack_fffffffffffffcf0,
                             (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                              *)in_stack_fffffffffffffce8,
                             (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                              *)0x7bfee3);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
          ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
                           *)local_c0,pgVar4 + sVar3,n_,pvVar5 + sVar3 * 0xf + (ulong)n_);
          goto LAB_007bffc5;
        }
        local_54 = local_54 - 1 & local_54;
      } while (local_54 != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffcf0,(size_t)in_stack_fffffffffffffce8);
    if (bVar1) {
      memset(local_c0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
      ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
                       *)local_c0);
      goto LAB_007bffc5;
    }
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_40,*(size_t *)(pcVar11 + 8));
  } while (bVar1);
  memset(local_c0,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
  ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>
                   *)local_c0);
LAB_007bffc5:
  iVar9 = boost::unordered::detail::foa::
          table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
          ::make_iterator((locator *)0x7bffd2);
  local_f0.pc_ = iVar9.pc_;
  local_90 = iVar9.p_;
  local_f0.p_ = local_90;
  puVar16 = local_f0.pc_;
  boost::unordered::detail::foa::
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  ::table_iterator<false,_nullptr>(&local_d0,&local_f0);
  local_168 = local_d0.pc_;
  local_160 = local_d0.p_;
  local_208 = boost::unordered::
              unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
              ::end((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                     *)0x7c0068);
  bVar1 = boost::unordered::detail::foa::operator!=
                    ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffffcf0,
                     (table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffffce8);
  code = SUB84((ulong)local_d0.pc_ >> 0x20,0);
  if (bVar1) {
    local_210 = (DefinitionSymbol *)0x0;
    ppVar6 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                           *)0x7c00af);
    local_218 = &ppVar6->second;
    local_220._M_current =
         (Symbol **)
         std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::begin
                   ((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)
                    in_stack_fffffffffffffce8);
    local_228 = (Symbol **)
                std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::end
                          ((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)
                           in_stack_fffffffffffffce8);
    puVar13 = local_d0.pc_;
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                        ((__normal_iterator<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                          *)in_stack_fffffffffffffcf0,
                         (__normal_iterator<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                          *)in_stack_fffffffffffffce8);
      code = SUB84((ulong)puVar13 >> 0x20,0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppSVar7 = __gnu_cxx::
                __normal_iterator<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
                ::operator*(&local_220);
      local_230 = *ppSVar7;
      if (local_230->kind == Definition) {
        local_238 = Symbol::as<slang::ast::DefinitionSymbol>(local_230);
        local_248 = local_1a0._M_len;
        local_240 = local_1a0._M_str;
        local_258 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffcf0);
        __x._M_str = pcVar12;
        __x._M_len = (size_t)pcVar2;
        __y._M_str = in_RDI;
        __y._M_len = (size_t)puVar10;
        bVar1 = std::operator==(__x,__y);
        code = SUB84((ulong)puVar13 >> 0x20,0);
        if (bVar1) {
LAB_007c01f2:
          local_210 = local_238;
          break;
        }
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_1a0);
        if (bVar1) {
          in_stack_fffffffffffffcf0 = (Diagnostic *)local_238->sourceLibrary;
          pDVar8 = (Diagnostic *)Symbol::getSourceLibrary(in_stack_fffffffffffffcf8);
          code = SUB84((ulong)puVar13 >> 0x20,0);
          if (in_stack_fffffffffffffcf0 == pDVar8) goto LAB_007c01f2;
        }
      }
      __gnu_cxx::
      __normal_iterator<slang::ast::Symbol_*const_*,_std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>_>
      ::operator++(&local_220);
    }
    if ((local_210 != (DefinitionSymbol *)0x0) &&
       ((local_210->definitionKind == Module || (local_210->definitionKind == Program)))) {
      return local_210;
    }
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd00.values_);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_1a0);
  if (bVar1) {
    std::__cxx11::string::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  }
  else {
    local_f8 = local_298;
    local_108 = "{}.{}";
    uStack_100 = 5;
    local_110 = &local_1a0;
    local_118 = local_190;
    local_128 = "{}.{}";
    uStack_120 = 5;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              (in_stack_fffffffffffffd00.values_,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffcf8);
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              (in_stack_fffffffffffffd00.values_,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffcf8);
    local_8 = &local_138;
    local_10 = local_158;
    local_138 = 0xdd;
    fmt.size_ = (size_t)puVar16;
    fmt.data_ = pcVar15;
    args.field_1.values_ = aVar14.values_;
    args.desc_ = (unsigned_long_long)in_stack_ffffffffffffff50;
    local_130 = local_10;
    ::fmt::v11::vformat_abi_cxx11_(fmt,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcf0);
  }
  std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::operator->
            ((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_> *)
             0x7c03ef);
  pDVar8 = Scope::addDiag(in_stack_fffffffffffffe28,code,in_stack_fffffffffffffe30);
  Diagnostic::operator<<(in_stack_fffffffffffffcf0,(string *)pDVar8);
  local_180 = (DefinitionSymbol *)0x0;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcf0);
  return local_180;
}

Assistant:

const DefinitionSymbol* Compilation::getDefinition(const ConfigBlockSymbol& config,
                                                   std::string_view cellName,
                                                   std::string_view libName,
                                                   SourceRange sourceRange) const {
    if (auto defIt = definitionMap.find(std::tuple{cellName, root.get()});
        defIt != definitionMap.end()) {

        const DefinitionSymbol* foundDef = nullptr;
        for (auto defSym : defIt->second.first) {
            if (defSym->kind != SymbolKind::Definition)
                continue;

            auto& def = defSym->as<DefinitionSymbol>();
            if (def.sourceLibrary.name == libName ||
                (libName.empty() && &def.sourceLibrary == config.getSourceLibrary())) {
                foundDef = &def;
                break;
            }
        }

        if (foundDef && (foundDef->definitionKind == DefinitionKind::Module ||
                         foundDef->definitionKind == DefinitionKind::Program)) {
            return foundDef;
        }
    }

    std::string errorName;
    if (!libName.empty())
        errorName = fmt::format("{}.{}", libName, cellName);
    else
        errorName = cellName;

    root->addDiag(diag::InvalidTopModule, sourceRange) << errorName;
    return nullptr;
}